

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt.cpp
# Opt level: O0

int getopt(int ___argc,char **___argv,char *__shortopts)

{
  long lVar1;
  int iVar2;
  long lVar3;
  bool local_41;
  char *optchar;
  int local_30;
  int l;
  int k;
  wchar_t d;
  wchar_t c;
  int i;
  char *optstring_local;
  char **argv_local;
  int argc_local;
  
  if ((musl_optind == 0) || (musl_optreset != 0)) {
    musl_optreset = 0;
    musl_optpos = 0;
    musl_optind = 1;
  }
  if ((musl_optind < ___argc) && (___argv[musl_optind] != (char *)0x0)) {
    if (*___argv[musl_optind] == '-') {
      if (___argv[musl_optind][1] == '\0') {
        argv_local._4_4_ = -1;
      }
      else if ((___argv[musl_optind][1] == '-') && (___argv[musl_optind][2] == '\0')) {
        musl_optind = musl_optind + 1;
        argv_local._4_4_ = -1;
      }
      else {
        if (musl_optpos == 0) {
          musl_optpos = 1;
        }
        _c = __shortopts;
        optstring_local = (char *)___argv;
        argv_local._0_4_ = ___argc;
        local_30 = mbtowc(&k,___argv[musl_optind] + musl_optpos,0x10);
        if (local_30 < 0) {
          local_30 = 1;
          k = 0xfffd;
        }
        lVar1 = *(long *)(optstring_local + (long)musl_optind * 8);
        lVar3 = (long)musl_optpos;
        musl_optpos = local_30 + musl_optpos;
        if (*(char *)(*(long *)(optstring_local + (long)musl_optind * 8) + (long)musl_optpos) ==
            '\0') {
          musl_optind = musl_optind + 1;
          musl_optpos = 0;
        }
        if ((*_c == '-') || (*_c == '+')) {
          _c = _c + 1;
        }
        d = L'\0';
        l = 0;
        do {
          iVar2 = mbtowc(&l,_c + d,0x10);
          if (iVar2 < 1) {
            d = d + L'\x01';
          }
          else {
            d = iVar2 + d;
          }
          local_41 = iVar2 != 0 && l != k;
        } while (local_41);
        if ((l == k) && (k != 0x3a)) {
          if (_c[d] == ':') {
            musl_optarg = (char *)0x0;
            if ((_c[d + L'\x01'] != ':') || (musl_optpos != 0)) {
              musl_optarg = (char *)(*(long *)(optstring_local + (long)musl_optind * 8) +
                                    (long)musl_optpos);
              musl_optpos = 0;
              musl_optind = musl_optind + 1;
            }
            if ((int)argv_local < musl_optind) {
              musl_optopt = k;
              if (*_c == ':') {
                return 0x3a;
              }
              if (musl_opterr != 0) {
                musl_getopt_msg(*(char **)optstring_local,": option requires an argument: ",
                                (char *)(lVar1 + lVar3),(long)local_30);
              }
              return 0x3f;
            }
          }
          argv_local._4_4_ = k;
        }
        else {
          musl_optopt = k;
          if ((*_c != ':') && (musl_opterr != 0)) {
            musl_getopt_msg(*(char **)optstring_local,": unrecognized option: ",
                            (char *)(lVar1 + lVar3),(long)local_30);
          }
          argv_local._4_4_ = 0x3f;
        }
      }
    }
    else if (*__shortopts == '-') {
      musl_optarg = ___argv[musl_optind];
      argv_local._4_4_ = 1;
      musl_optind = musl_optind + 1;
    }
    else {
      argv_local._4_4_ = -1;
    }
  }
  else {
    argv_local._4_4_ = -1;
  }
  return argv_local._4_4_;
}

Assistant:

static int getopt(int argc, char *argv[], char const *optstring)
{
	int i;
	wchar_t c, d;
	int k, l;
	char *optchar;

	if (!musl_optind || musl_optreset) {
		musl_optreset = 0;
		musl_optpos = 0;
		musl_optind = 1;
	}

	if (musl_optind >= argc || !argv[musl_optind])
		return -1;

	if (argv[musl_optind][0] != '-') {
		if (optstring[0] == '-') {
			musl_optarg = argv[musl_optind++];
			return 1;
		}
		return -1;
	}

	if (!argv[musl_optind][1])
		return -1;

	if (argv[musl_optind][1] == '-' && !argv[musl_optind][2])
		return musl_optind++, -1;

	if (!musl_optpos)
		musl_optpos++;
	k = mbtowc(&c, argv[musl_optind] + musl_optpos, MB_LEN_MAX);
	if (k < 0) {
		k = 1;
		c = 0xFFFD; /* replacement char */
	}
	optchar = argv[musl_optind] + musl_optpos;
	musl_optpos += k;

	if (!argv[musl_optind][musl_optpos]) {
		musl_optind++;
		musl_optpos = 0;
	}

	if (optstring[0] == '-' || optstring[0] == '+')
		optstring++;

	i = 0;
	d = 0;
	do {
		l = mbtowc(&d, optstring+i, MB_LEN_MAX);
		if (l > 0)
			i += l;
		else
			i++;
	} while (l && d != c);

	if (d != c || c == ':') {
		musl_optopt = c;
		if (optstring[0] != ':' && musl_opterr)
			musl_getopt_msg(argv[0], ": unrecognized option: ", optchar, k);
		return '?';
	}
	if (optstring[i] == ':') {
		musl_optarg = 0;
		if (optstring[i + 1] != ':' || musl_optpos) {
			musl_optarg = argv[musl_optind++] + musl_optpos;
			musl_optpos = 0;
		}
		if (musl_optind > argc) {
			musl_optopt = c;
			if (optstring[0] == ':')
				return ':';
			if (musl_opterr)
				musl_getopt_msg(argv[0], ": option requires an argument: ",
						optchar, k);
			return '?';
		}
	}
	return c;
}